

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_gej_add_ge_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b,secp256k1_fe *rzr)

{
  secp256k1_fe *a_00;
  int iVar1;
  secp256k1_fe h;
  secp256k1_fe s1;
  secp256k1_fe u1;
  secp256k1_fe i;
  secp256k1_fe u2;
  secp256k1_fe z12;
  secp256k1_fe t;
  secp256k1_fe h3;
  secp256k1_fe h2;
  secp256k1_fe s2;
  
  secp256k1_gej_verify(a);
  secp256k1_ge_verify(b);
  if (a->infinity == 0) {
    if (b->infinity != 0) {
      if (rzr != (secp256k1_fe *)0x0) {
        secp256k1_fe_set_int(rzr,1);
      }
      memcpy(r,a,0x98);
      return;
    }
    a_00 = &a->z;
    secp256k1_fe_sqr(&z12,a_00);
    u1.n[0] = (a->x).n[0];
    u1.n[1] = (a->x).n[1];
    u1.n[2] = (a->x).n[2];
    u1.n[3] = (a->x).n[3];
    u1.n[4] = (a->x).n[4];
    u1.magnitude = (a->x).magnitude;
    u1.normalized = (a->x).normalized;
    secp256k1_fe_mul(&u2,&b->x,&z12);
    s1.n[0] = (a->y).n[0];
    s1.n[1] = (a->y).n[1];
    s1.n[2] = (a->y).n[2];
    s1.n[3] = (a->y).n[3];
    s1.n[4] = (a->y).n[4];
    s1.magnitude = (a->y).magnitude;
    s1.normalized = (a->y).normalized;
    secp256k1_fe_mul(&s2,&b->y,&z12);
    secp256k1_fe_mul(&s2,&s2,a_00);
    secp256k1_fe_negate_unchecked(&h,&u1,4);
    secp256k1_fe_add(&h,&u2);
    secp256k1_fe_negate_unchecked(&i,&s2,1);
    secp256k1_fe_add(&i,&s1);
    iVar1 = secp256k1_fe_normalizes_to_zero_var(&h);
    if (iVar1 == 0) {
      r->infinity = 0;
      if (rzr != (secp256k1_fe *)0x0) {
        rzr->n[4] = h.n[4];
        rzr->magnitude = h.magnitude;
        rzr->normalized = h.normalized;
        rzr->n[2] = h.n[2];
        rzr->n[3] = h.n[3];
        rzr->n[0] = h.n[0];
        rzr->n[1] = h.n[1];
      }
      secp256k1_fe_mul(&r->z,a_00,&h);
      secp256k1_fe_sqr(&h2,&h);
      secp256k1_fe_negate_unchecked(&h2,&h2,1);
      secp256k1_fe_mul(&h3,&h2,&h);
      secp256k1_fe_mul(&t,&u1,&h2);
      secp256k1_fe_sqr(&r->x,&i);
      secp256k1_fe_add(&r->x,&h3);
      secp256k1_fe_add(&r->x,&t);
      secp256k1_fe_add(&r->x,&t);
      secp256k1_fe_add(&t,&r->x);
      secp256k1_fe_mul(&r->y,&t,&i);
      secp256k1_fe_mul(&h3,&h3,&s1);
      secp256k1_fe_add(&r->y,&h3);
      secp256k1_gej_verify(r);
      if (rzr != (secp256k1_fe *)0x0) {
        secp256k1_fe_verify(rzr);
      }
    }
    else {
      iVar1 = secp256k1_fe_normalizes_to_zero_var(&i);
      if (iVar1 == 0) {
        if (rzr != (secp256k1_fe *)0x0) {
          secp256k1_fe_set_int(rzr,0);
        }
        secp256k1_gej_set_infinity(r);
      }
      else {
        secp256k1_gej_double_var(r,a,rzr);
      }
    }
    return;
  }
  if (rzr == (secp256k1_fe *)0x0) {
    secp256k1_gej_set_ge(r,b);
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/group_impl.h"
          ,0x236,"test condition failed: rzr == NULL");
  abort();
}

Assistant:

static void secp256k1_gej_add_ge_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b, secp256k1_fe *rzr) {
    /* Operations: 8 mul, 3 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe z12, u1, u2, s1, s2, h, i, h2, h3, t;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GE_VERIFY(b);

    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        secp256k1_gej_set_ge(r, b);
        return;
    }
    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }

    secp256k1_fe_sqr(&z12, &a->z);
    u1 = a->x;
    secp256k1_fe_mul(&u2, &b->x, &z12);
    s1 = a->y;
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, SECP256K1_GEJ_X_MAGNITUDE_MAX); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    if (rzr != NULL) {
        *rzr = h;
    }
    secp256k1_fe_mul(&r->z, &a->z, &h);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);

    SECP256K1_GEJ_VERIFY(r);
    if (rzr != NULL) SECP256K1_FE_VERIFY(rzr);
}